

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

int mctools_is_same_file(mcu8str *p1raw,mcu8str *p2raw)

{
  int iVar1;
  FILE *pFVar2;
  FILE *fh_1;
  mcu8str native_1;
  FILE *fh;
  mcu8str native;
  char buf [4096];
  stat sinfo2;
  stat sinfo1;
  mcu8str p2;
  mcu8str p1;
  mcu8str *in_stack_ffffffffffffee48;
  undefined7 in_stack_ffffffffffffee50;
  undefined1 in_stack_ffffffffffffee57;
  mcu8str *in_stack_ffffffffffffee58;
  mcu8str *in_stack_ffffffffffffee60;
  char *local_1180;
  __dev_t local_168;
  __ino_t local_160;
  uint local_150;
  mcu8str *in_stack_ffffffffffffff10;
  stat local_d8;
  uint local_4;
  
  mctools_impl_view_no_winnamespace
            ((mcu8str *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  mctools_impl_view_no_winnamespace
            ((mcu8str *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  iVar1 = mcu8str_equal((mcu8str *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                        in_stack_ffffffffffffee48);
  if (iVar1 == 0) {
    mcu8str_create_from_staticbuffer
              ((char *)in_stack_ffffffffffffee60,(mcu8str_size_t)in_stack_ffffffffffffee58);
    mcu8str_assign(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58);
    mctools_pathseps_platform
              ((mcu8str *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    pFVar2 = fopen(local_1180,"rb");
    mcu8str_dealloc((mcu8str *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    if (pFVar2 == (FILE *)0x0) {
      local_4 = 0;
    }
    else {
      iVar1 = fileno(pFVar2);
      iVar1 = fstat(iVar1,&local_d8);
      if (iVar1 == 0) {
        fclose(pFVar2);
        if ((local_d8.st_mode & 0xf000) == 0x4000) {
          local_4 = 0;
        }
        else {
          mcu8str_create_from_staticbuffer
                    ((char *)in_stack_ffffffffffffee60,(mcu8str_size_t)in_stack_ffffffffffffee58);
          mcu8str_assign(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58);
          mctools_pathseps_platform
                    ((mcu8str *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
          pFVar2 = fopen((char *)in_stack_ffffffffffffee60,"rb");
          mcu8str_dealloc((mcu8str *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
          if (pFVar2 == (FILE *)0x0) {
            local_4 = 0;
          }
          else {
            iVar1 = fileno(pFVar2);
            iVar1 = fstat(iVar1,(stat *)&local_168);
            if (iVar1 == 0) {
              fclose(pFVar2);
              if ((local_150 & 0xf000) == 0x4000) {
                local_4 = 0;
              }
              else {
                local_4 = (uint)(local_d8.st_dev == local_168 && local_d8.st_ino == local_160);
              }
            }
            else {
              fclose(pFVar2);
              local_4 = 0;
            }
          }
        }
      }
      else {
        fclose(pFVar2);
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = mctools_is_file(in_stack_ffffffffffffff10);
  }
  return local_4;
}

Assistant:

int mctools_is_same_file( const mcu8str* p1raw, const mcu8str* p2raw )
  {
    mcu8str p1 = mctools_impl_view_no_winnamespace(p1raw);
    mcu8str p2 = mctools_impl_view_no_winnamespace(p2raw);

    //First check for trivial string equality:
    if ( mcu8str_equal( &p1, &p2 ) )
      return mctools_is_file( &p1 );

#ifdef MC_IS_WINDOWS
    //Open files and query file information. Note that we try to keep both
    //handles open while querying info, for consistent results.
    mcwinstr wp1 = mc_path2wpath( &p1 );
    mcwinstr wp2 = mc_path2wpath( &p2 );

    DWORD share = FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE;
    DWORD access = FILE_READ_ATTRIBUTES;
    DWORD flags = FILE_FLAG_BACKUP_SEMANTICS;
    HANDLE fh1 = CreateFileW( wp1.c_str,
                              access,
                              share,
                              NULL,
                              OPEN_EXISTING,
                              flags,
                              NULL );
    mc_winstr_dealloc( &wp1 );
    if ( fh1 == INVALID_HANDLE_VALUE ) {
      mc_winstr_dealloc( &wp2 );
      return 0;//failed
    }
    HANDLE fh2 = CreateFileW( wp2.c_str,
                              access,
                              share,
                              NULL,
                              OPEN_EXISTING,
                              flags,
                              NULL );
    mc_winstr_dealloc( &wp2 );
    if ( fh2 == INVALID_HANDLE_VALUE ) {
      CloseHandle( fh1 );
      return 0;//failed
    }

    BY_HANDLE_FILE_INFORMATION info1;
    BY_HANDLE_FILE_INFORMATION info2;
    memset( &info1, 0, sizeof(info1) );
    memset( &info2, 0, sizeof(info2) );

    int got_info = ( GetFileInformationByHandle( fh1, &info1 )
                     && GetFileInformationByHandle( fh2, &info2 ) ) ? 1 : 0;
    CloseHandle(fh1);
    CloseHandle(fh2);
    if ( !got_info )
      return 0;

    //always false for directories:
    if ( info1.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY )
      return 0;
    if ( info2.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY )
      return 0;

    //Now compare index:
    if ( info1.nFileIndexLow != info2.nFileIndexLow )
      return 0;
    if ( info1.nFileIndexHigh != info2.nFileIndexHigh )
      return 0;
    if ( info1.dwVolumeSerialNumber != info2.dwVolumeSerialNumber )
      return 0;
    //Extra checks, added for safety in cases of rare clashes in the above:
    if ( info1.nFileSizeLow != info2.nFileSizeLow )
      return 0;
    if ( info1.nFileSizeHigh != info2.nFileSizeHigh )
      return 0;
    if ( info1.nNumberOfLinks != info2.nNumberOfLinks )
      return 0;
    if ( info1.dwFileAttributes != info2.dwFileAttributes )
      return 0;
    //Finally, look at the creation time:
    if ( CompareFileTime( &info1.ftCreationTime,
                          &info2.ftCreationTime ) != 0 )
      return 0;

    //Must be the same file (even though the two paths might still represent two
    //separate files in the file-system, but hardlinked to the same actual file
    //node).
    return 1;
#else
    //A hopefully bullet proof way, (st_ino,st_dev) uniquely identifies a file
    //on a POSIX system.
    struct stat sinfo1;
    struct stat sinfo2;
    char buf[4096];
    {
      mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
      mcu8str_assign( &native, &p1 );
      mctools_pathseps_platform( &native );
      FILE * fh = fopen(native.c_str,"rb");
      mcu8str_dealloc(&native);
      if ( !fh )
        return 0;
      if ( fstat(fileno(fh), &sinfo1) != 0 ) {
        fclose(fh);
        return 0;
      }
      fclose(fh);
    }
    if ( S_ISDIR(sinfo1.st_mode) )
      return 0;//always false for directories
    {
      mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
      mcu8str_assign( &native, &p2 );
      mctools_pathseps_platform( &native );
      FILE * fh = fopen(native.c_str,"rb");
      mcu8str_dealloc(&native);
      if ( !fh )
        return 0;
      if ( fstat(fileno(fh), &sinfo2) != 0 ) {
        fclose(fh);
        return 0;
      }
      fclose(fh);
    }
    if ( S_ISDIR(sinfo2.st_mode) )
      return 0;//always false for directories
    return ( sinfo1.st_dev == sinfo2.st_dev
             && sinfo1.st_ino == sinfo2.st_ino ) ? 1 : 0;
#endif
  }